

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::splitAt(VerySimpleReadOnlyString *this,int pos,int stripFromRet)

{
  int iVar1;
  char *__s;
  undefined8 *puVar2;
  int iVar3;
  size_t sVar4;
  int in_ECX;
  undefined4 in_register_00000014;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  VerySimpleReadOnlyString VVar6;
  
  uVar5 = CONCAT44(in_register_00000014,stripFromRet);
  if (stripFromRet < 0) {
    this->data = (tCharPtr)0x0;
    this->length = 0;
  }
  else {
    puVar2 = (undefined8 *)CONCAT44(in_register_00000034,pos);
    if (stripFromRet <= in_ECX) {
      in_ECX = stripFromRet;
    }
    __s = *(char **)CONCAT44(in_register_00000034,pos);
    iVar1 = *(int *)(CONCAT44(in_register_00000034,pos) + 8);
    iVar3 = stripFromRet - in_ECX;
    if (iVar1 <= stripFromRet - in_ECX) {
      iVar3 = iVar1;
    }
    this->data = __s;
    if (iVar3 == -1) {
      if (__s == (char *)0x0) {
        iVar3 = 0;
      }
      else {
        sVar4 = strlen(__s);
        iVar3 = (int)sVar4;
        uVar5 = extraout_RDX;
      }
    }
    this->length = iVar3;
    if (iVar1 < stripFromRet) {
      *(undefined4 *)(puVar2 + 1) = 0;
    }
    else {
      *puVar2 = __s + (uint)stripFromRet;
      *(int *)(puVar2 + 1) = iVar1 - stripFromRet;
    }
  }
  VVar6._8_8_ = uVar5;
  VVar6.data = (tCharPtr)this;
  return VVar6;
}

Assistant:

VerySimpleReadOnlyString VerySimpleReadOnlyString::splitAt(int pos, int stripFromRet)
    {
        if (stripFromRet > pos) stripFromRet = pos;
        if (pos < 0) return VerySimpleReadOnlyString();
        VerySimpleReadOnlyString ret(data, min(pos - stripFromRet, length));
        if (pos > length) (void)Mutate(data, 0);
        else (void)Mutate(data + pos, length - pos);
        return ret;
    }